

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall
AddrManImpl::Unserialize<HashVerifier<DataStream>>(AddrManImpl *this,HashVerifier<DataStream> *s_)

{
  uint256 *this_00;
  int *fmt;
  unordered_map<int,_AddrInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_AddrInfo>_>_>
  *this_01;
  int *__x;
  _Hash_node_base *p_Var1;
  string msg;
  long lVar2;
  pointer ppVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Network NVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  _Node_const_iterator<std::pair<const_int,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  _Hash_node_base *p_Var14;
  InvalidAddrManVersionError *this_02;
  string *psVar15;
  int iVar16;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *this_03;
  int *fmt_00;
  pointer ppVar17;
  char *s_00;
  int *piVar18;
  LogFlags flag;
  int iVar19;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  AddrManImpl *pAVar20;
  AddrManImpl *this_04;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffe4c;
  vector<int,_std::allocator<int>_> *this_05;
  undefined4 uVar22;
  undefined8 in_stack_fffffffffffffe50;
  _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_06;
  int (*args_1) [64];
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> s;
  SerParams ser_params;
  Format format;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  int entry_index_1;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar18 = (int *)0xe9;
  flag = NONE;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->cs,"cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp",
             0xe9,false);
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                  ,0xeb,
                  "void AddrManImpl::Unserialize(Stream &) [Stream = HashVerifier<DataStream>]");
  }
  supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = &format;
  Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<DataStream>>
            ((Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *)&supplied_asmap_checksum,
             s_);
  ser_params._1_7_ = 0;
  ser_params.super_SerParams.enc._0_1_ = V2_ASMAP < format;
  s.m_params = &ser_params;
  s.m_substream = s_;
  compat = ser_readdata8<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
  if (compat < 0x20) {
    psVar15 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&compat," m_banned_mutex",(uchar *)piVar18);
    std::ios_base::failure[abi:cxx11]::failure(psVar15);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afbf5;
  }
  lowest_compatible = compat - 0x20;
  if (4 < lowest_compatible) {
    this_02 = (InvalidAddrManVersionError *)__cxa_allocate_exception(0x20);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = format;
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\x04';
    tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
              (&local_58,
               (tinyformat *)
               "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
               ,(char *)&supplied_asmap_checksum,&lowest_compatible,(uchar *)"Bitcoin Core",
               (char (*) [13])&serialized_asmap_checksum,(uchar *)this);
    msg._M_string_length._0_4_ = in_stack_fffffffffffffe40;
    msg._M_dataplus._M_p = (pointer)this;
    msg._M_string_length._4_4_ = in_stack_fffffffffffffe44;
    msg.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe48;
    msg.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe4c;
    msg.field_2._8_8_ = in_stack_fffffffffffffe50;
    InvalidAddrManVersionError::InvalidAddrManVersionError(this_02,msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_02,&InvalidAddrManVersionError::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afbf5;
  }
  this_00 = &this->nKey;
  base_blob<256u>::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
            ((base_blob<256u> *)this_00,&s);
  uVar5 = ser_readdata32<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
  this->nNew = uVar5;
  uVar5 = ser_readdata32<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
  fmt_00 = &this->nTried;
  *fmt_00 = uVar5;
  pAVar20 = this;
  uVar6 = ser_readdata32<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
  fmt = &this->nNew;
  uVar5 = uVar6 ^ 0x40000000;
  if (format == V0_HISTORICAL) {
    uVar5 = uVar6;
  }
  uVar9 = *fmt;
  if (0x10000 < uVar9) {
    psVar15 = (string *)__cxa_allocate_exception(0x20);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\x01';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    tinyformat::format<int,int>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
               (char *)fmt,(int *)&serialized_asmap_checksum,piVar18);
    std::ios_base::failure[abi:cxx11]::failure(psVar15);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afbf5;
  }
  if (0x4000 < (uint)*fmt_00) {
    psVar15 = (string *)__cxa_allocate_exception(0x20);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '@';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    tinyformat::format<int,int>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
               (char *)fmt_00,(int *)&serialized_asmap_checksum,piVar18);
    std::ios_base::failure[abi:cxx11]::failure(psVar15);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afbf5;
  }
  this_05 = &pAVar20->vRandom;
  this_01 = &pAVar20->mapInfo;
  this_06 = (_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&pAVar20->mapAddr;
  this_03 = &pAVar20->m_network_counts;
  iVar16 = 0;
  while (supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar16,
        supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar16 >> 8)
        , supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] =
               (char)((uint)iVar16 >> 0x10),
        supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] =
             (char)((uint)iVar16 >> 0x18), iVar16 < (int)uVar9) {
    pmVar11 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_01,(key_type *)&supplied_asmap_checksum);
    AddrInfo::
    SerializationOps<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,AddrInfo,ActionUnserialize>
              (pmVar11,&s);
    uVar22 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_;
    pmVar12 = std::__detail::
              _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_06,(key_type *)pmVar11);
    *pmVar12 = uVar22;
    pmVar11->nRandomPos =
         (int)((ulong)((long)(pAVar20->vRandom).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pAVar20->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::push_back
              (this_05,(value_type_conflict2 *)&supplied_asmap_checksum);
    NVar7 = CNetAddr::GetNetwork((CNetAddr *)pmVar11);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar7;
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(NVar7 >> 8);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(NVar7 >> 0x10);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(NVar7 >> 0x18);
    pmVar13 = std::__detail::
              _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_03,(key_type *)&serialized_asmap_checksum);
    pmVar13->n_new = pmVar13->n_new + 1;
    uVar9 = *fmt;
    iVar16 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ + 1;
  }
  pAVar20->nIdCount = uVar9;
  nLost = 0;
  __x = &pAVar20->nIdCount;
  iVar16 = 0;
  this_04 = pAVar20;
  for (iVar19 = 0; iVar19 < *fmt_00; iVar19 = iVar19 + 1) {
    AddrInfo::AddrInfo((AddrInfo *)&supplied_asmap_checksum);
    AddrInfo::
    SerializationOps<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,AddrInfo,ActionUnserialize>
              ((AddrInfo *)&supplied_asmap_checksum,&s);
    iVar8 = AddrInfo::GetTriedBucket
                      ((AddrInfo *)&supplied_asmap_checksum,this_00,this_04->m_netgroupman);
    uVar9 = AddrInfo::GetBucketPosition((AddrInfo *)&supplied_asmap_checksum,this_00,false,iVar8);
    bVar4 = CNetAddr::IsValid((CNetAddr *)&supplied_asmap_checksum);
    if (bVar4) {
      lVar2 = (ulong)(uint)(iVar8 << 8) + 0x174;
      if (*(int *)((long)pAVar20->vvTried[0] + (ulong)uVar9 * 4 + lVar2 + -0x174) != -1)
      goto LAB_006af469;
      std::vector<int,_std::allocator<int>_>::push_back(this_05,__x);
      pmVar11 = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,__x);
      AddrInfo::operator=(pmVar11,(AddrInfo *)&supplied_asmap_checksum);
      iVar8 = *__x;
      pmVar12 = std::__detail::
                _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](this_06,(key_type *)&supplied_asmap_checksum);
      *pmVar12 = iVar8;
      iVar8 = *__x;
      *(int *)((long)pAVar20->vvTried[0] + (ulong)uVar9 * 4 + lVar2 + -0x174) = iVar8;
      *__x = iVar8 + 1;
      NVar7 = CNetAddr::GetNetwork((CNetAddr *)&supplied_asmap_checksum);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar7;
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(NVar7 >> 8);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(NVar7 >> 0x10);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(NVar7 >> 0x18);
      pmVar13 = std::__detail::
                _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_03,(key_type *)&serialized_asmap_checksum);
      pmVar13->n_tried = pmVar13->n_tried + 1;
    }
    else {
LAB_006af469:
      iVar16 = iVar16 + 1;
      nLost = iVar16;
    }
    AddrInfo::~AddrInfo((AddrInfo *)&supplied_asmap_checksum);
  }
  *fmt_00 = *fmt_00 - iVar16;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar19 = 0;
  while( true ) {
    iVar8 = (int)piVar18;
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar19;
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar19 >> 8);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar19 >> 0x10);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar19 >> 0x18);
    if ((int)uVar5 <= iVar19) break;
    uVar6 = ser_readdata32<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    while (bVar4 = uVar6 != 0, uVar6 = uVar6 - 1, bVar4) {
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ =
           serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ &
           0xffffffff00000000;
      uVar10 = ser_readdata32<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(&s);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar10;
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(uVar10 >> 8);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(uVar10 >> 0x10);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(uVar10 >> 0x18);
      if ((-1 < (int)uVar10) && ((int)uVar10 < *fmt)) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&bucket_entries,
                   (int *)&supplied_asmap_checksum,(int *)&serialized_asmap_checksum);
      }
    }
    iVar19 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ + 1;
  }
  s_00 = (char *)this_04->m_netgroupman;
  NetGroupManager::GetAsmapChecksum(&supplied_asmap_checksum,(NetGroupManager *)s_00);
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  if (V1_DETERMINISTIC < format) {
    s_00 = (char *)&s;
    base_blob<256u>::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
              ((base_blob<256u> *)&serialized_asmap_checksum,
               (ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)s_00);
  }
  uVar22 = (undefined4)((ulong)this_05 >> 0x20);
  if (uVar5 == 0x400) {
    s_00 = (char *)&supplied_asmap_checksum;
    bVar4 = ::operator==(&serialized_asmap_checksum.super_base_blob<256U>,(base_blob<256U> *)s_00);
    uVar21 = (undefined4)CONCAT71((int7)((ulong)fmt_00 >> 8),1);
    if (!bVar4) goto LAB_006af631;
  }
  else {
LAB_006af631:
    bVar4 = ::LogAcceptCategory(ADDRMAN,(Level)s_00);
    if (bVar4) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file._M_len = 0x54;
      logging_function._M_str = "Unserialize";
      logging_function._M_len = 0xb;
      s_00 = "Unserialize";
      ::LogPrintf_<>(logging_function,source_file,iVar8,flag,(Level)this_04,
                     (char *)CONCAT44(iVar16,in_stack_fffffffffffffe40));
    }
    uVar21 = 0;
  }
  ppVar3 = bucket_entries.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  args_1 = this_04->vvNew;
  for (ppVar17 = bucket_entries.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVar17 != ppVar3; ppVar17 = ppVar17 + 1)
  {
    iVar19 = ppVar17->first;
    entry_index_1 = ppVar17->second;
    s_00 = (char *)&entry_index_1;
    pmVar11 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_01,(key_type *)&entry_index_1);
    bVar4 = CNetAddr::IsValid((CNetAddr *)pmVar11);
    if ((bVar4) && (pmVar11->nRefCount < 8)) {
      s_00 = (char *)this_00;
      uVar9 = AddrInfo::GetBucketPosition(pmVar11,this_00,true,iVar19);
      if ((char)uVar21 == '\0') {
LAB_006af6f0:
        iVar19 = AddrInfo::GetNewBucket(pmVar11,this_00,this_04->m_netgroupman);
        s_00 = (char *)this_00;
        uVar9 = AddrInfo::GetBucketPosition(pmVar11,this_00,true,iVar19);
        if (args_1[iVar19][uVar9] != -1) goto LAB_006af748;
        piVar18 = args_1[iVar19] + uVar9;
      }
      else {
        if (args_1[iVar19][uVar9] != -1) goto LAB_006af6f0;
        piVar18 = args_1[iVar19] + uVar9;
      }
      *piVar18 = entry_index_1;
      pmVar11->nRefCount = pmVar11->nRefCount + 1;
    }
LAB_006af748:
  }
  nLostUnk = 0;
  iVar19 = 0;
  p_Var14 = (this_04->mapInfo)._M_h._M_before_begin._M_nxt;
  while (p_Var14 != (_Hash_node_base *)0x0) {
    if ((*(char *)&p_Var14[0x11]._M_nxt == '\0') && (*(int *)((long)&p_Var14[0x10]._M_nxt + 4) == 0)
       ) {
      p_Var1 = p_Var14->_M_nxt;
      s_00 = (char *)(ulong)*(uint *)&p_Var14[1]._M_nxt;
      Delete(this_04,*(uint *)&p_Var14[1]._M_nxt);
      iVar19 = iVar19 + 1;
      p_Var14 = p_Var1;
      nLostUnk = iVar19;
    }
    else {
      p_Var14 = p_Var14->_M_nxt;
    }
  }
  if (iVar19 + iVar16 != 0 && SCARRY4(iVar19,iVar16) == iVar19 + iVar16 < 0) {
    bVar4 = ::LogAcceptCategory(ADDRMAN,(Level)s_00);
    if (bVar4) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file_00._M_len = 0x54;
      logging_function_00._M_str = "Unserialize";
      logging_function_00._M_len = 0xb;
      LogPrintf_<int,int>(logging_function_00,source_file_00,(int)&nLostUnk,(LogFlags)&nLost,
                          (Level)this_04,(char *)CONCAT44(iVar16,in_stack_fffffffffffffe40),
                          (int *)CONCAT44(uVar22,uVar21),*args_1);
    }
  }
  check_code = CheckAddrman(this_04);
  if (check_code == 0) {
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&bucket_entries.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    psVar15 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<int>
              ((string *)&entry_index_1,"Corrupt data. Consistency check failed with code %s",
               &check_code);
    std::ios_base::failure[abi:cxx11]::failure(psVar15);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_006afbf5:
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}